

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeMaskedColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,Vec4 *colorMaskFactor,Vec4 *colorMaskNegationFactor,bool isSRGB,
          PixelBufferAccess *colorBuffer)

{
  Fragment *pFVar1;
  ulong uVar2;
  int i;
  int iVar3;
  long lVar4;
  int y;
  Vec3 *pVVar5;
  ulong uVar6;
  Vec4 originalColor;
  Vec4 local_98;
  int local_80;
  int local_7c;
  Fragment *local_78;
  Vec4 *local_70;
  Vec4 *local_68;
  tcu local_60 [8];
  float afStack_58 [4];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pVVar5 = &this->m_sampleRegister[0].blendedRGB;
  uVar6 = 0;
  local_80 = fragNdxOffset;
  local_7c = numSamplesPerFragment;
  local_78 = inputFragments;
  local_70 = colorMaskFactor;
  local_68 = colorMaskNegationFactor;
  do {
    if (this->m_sampleRegister[uVar6].isAlive == true) {
      uVar2 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      iVar3 = (int)((long)uVar2 / (long)local_7c) + local_80;
      pFVar1 = local_78 + iVar3;
      y = (int)((long)uVar2 % (long)local_7c);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&local_48,(int)colorBuffer,y,
                 local_78[iVar3].pixelCoord.m_data[0]);
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      afStack_58[0] = 0.0;
      afStack_58[1] = 1.4013e-45;
      afStack_58[2] = 2.8026e-45;
      lVar4 = 0;
      do {
        local_98.m_data[(int)afStack_58[lVar4]] = pVVar5->m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_98.m_data[3] = this->m_sampleRegister[uVar6].blendedA;
      if (isSRGB) {
        tcu::linearToSRGB(local_60,&local_98);
        local_98.m_data._0_8_ = local_60;
        local_98.m_data[2] = afStack_58[0];
        local_98.m_data[3] = afStack_58[1];
      }
      local_98.m_data[1] =
           local_68->m_data[1] * fStack_44 + local_70->m_data[1] * local_98.m_data[1];
      local_98.m_data[0] = local_68->m_data[0] * local_48 + local_70->m_data[0] * local_98.m_data[0]
      ;
      local_98.m_data[3] =
           local_68->m_data[3] * fStack_3c + local_70->m_data[3] * local_98.m_data[3];
      local_98.m_data[2] =
           local_68->m_data[2] * fStack_40 + local_70->m_data[2] * local_98.m_data[2];
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,&local_98,y,(pFVar1->pixelCoord).m_data[0],
                 (pFVar1->pixelCoord).m_data[1]);
    }
    uVar6 = uVar6 + 1;
    pVVar5 = pVVar5 + 0xb;
  } while (uVar6 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeMaskedColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const Vec4& colorMaskFactor, const Vec4& colorMaskNegationFactor, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				originalColor	= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
			Vec4				newColor;

			newColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			newColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				newColor = tcu::linearToSRGB(newColor);

			newColor = colorMaskFactor*newColor + colorMaskNegationFactor*originalColor;

			colorBuffer.setPixel(newColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}